

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O2

size_t xmi_process_TIMB(PBuffer *buffer,MidiFile *param_2)

{
  byte bVar1;
  byte bVar2;
  element_type *peVar3;
  byte *pbVar4;
  Stream *pSVar5;
  ostream *poVar6;
  allocator<char> local_89;
  undefined1 local_88 [16];
  undefined1 local_78 [40];
  string local_50 [32];
  
  peVar3 = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar3->endianess = EndianessLittle;
  poVar6 = (ostream *)(ulong)*(ushort *)peVar3->read;
  peVar3->read = (uint8_t *)((long)peVar3->read + 2);
  if ((long)poVar6 * 2 + 2U == peVar3->size) {
    for (local_88._0_8_ = (ostream *)0x0; (ulong)local_88._0_8_ < poVar6;
        local_88._0_8_ = local_88._0_8_ + 1) {
      peVar3 = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pbVar4 = peVar3->read;
      bVar1 = *pbVar4;
      peVar3->read = pbVar4 + 1;
      bVar2 = pbVar4[1];
      peVar3->read = pbVar4 + 2;
      std::__cxx11::string::string<std::allocator<char>>(local_50,"xmi2mid",&local_89);
      Log::Logger::operator[]((Logger *)local_78,(string *)&Log::Verbose);
      pSVar5 = Log::Stream::operator<<((Stream *)local_78,"\tTIMB entry ");
      pSVar5 = Log::Stream::operator<<(pSVar5,(unsigned_long *)local_88);
      pSVar5 = Log::Stream::operator<<(pSVar5,": ");
      local_88._12_4_ = ZEXT14(bVar1);
      pSVar5 = Log::Stream::operator<<(pSVar5,(int *)(local_88 + 0xc));
      pSVar5 = Log::Stream::operator<<(pSVar5,", ");
      local_88._8_4_ = ZEXT14(bVar2);
      Log::Stream::operator<<(pSVar5,(int *)(local_88 + 8));
      Log::Stream::~Stream((Stream *)local_78);
      std::__cxx11::string::~string(local_50);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_78 + 8),"xmi2mid",(allocator<char> *)local_78);
    Log::Logger::operator[]((Logger *)local_88,(string *)&Log::Debug);
    Log::Stream::operator<<((Stream *)local_88,"\tInconsistent TIMB block.");
    Log::Stream::~Stream((Stream *)local_88);
    std::__cxx11::string::~string((string *)(local_78 + 8));
  }
  return ((buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->size;
}

Assistant:

static size_t
xmi_process_TIMB(PBuffer buffer, MidiFile * /*midi*/) {
  buffer->set_endianess(Buffer::EndianessLittle);
  size_t count = buffer->pop<uint16_t>();
  if (count*2 + 2 != buffer->get_size()) {
    Log::Debug["xmi2mid"] << "\tInconsistent TIMB block.";
  } else {
    for (size_t i = 0; i < count; i++) {
      uint8_t patch = buffer->pop<uint8_t>();
      uint8_t bank = buffer->pop<uint8_t>();
      Log::Verbose["xmi2mid"] << "\tTIMB entry " << i << ": "
                              << static_cast<int>(patch) << ", "
                              << static_cast<int>(bank);
    }
  }
  return buffer->get_size();
}